

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O3

RefCntAutoPtr<Diligent::IAsyncTask> __thiscall
Diligent::anon_unknown_1::CompiledShaderGL::GetCompileTask(CompiledShaderGL *this)

{
  long in_RSI;
  
  if (*(long *)(in_RSI + 0xe0) == 0) {
    (this->super_CompiledShader)._vptr_CompiledShader = (_func_int **)0x0;
  }
  else {
    AsyncInitializer::GetCompileTask((AsyncInitializer *)this);
  }
  return (RefCntAutoPtr<Diligent::IAsyncTask>)(IAsyncTask *)this;
}

Assistant:

virtual RefCntAutoPtr<IAsyncTask> GetCompileTask() const override final
    {
        return AsyncInitializer::GetAsyncTask(m_AsyncInitializer);
    }